

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_table.hpp
# Opt level: O2

int __thiscall andyzip::huffman_table<18>::init(huffman_table<18> *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  uint in_ECX;
  ulong uVar2;
  ulong uVar3;
  ushort *in_RDX;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  EVP_PKEY_CTX EVar8;
  EVP_PKEY_CTX EVar9;
  uint uVar10;
  EVP_PKEY_CTX EVar11;
  ulong uVar12;
  
  this->invalid_ = true;
  if (in_ECX == 2) {
    this->min_length_ = '\x01';
    this->max_length_ = '\x01';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    this->symbols_[0] = *in_RDX;
    in_ECX = (uint)in_RDX[1];
    this->symbols_[1] = in_RDX[1];
  }
  else if (in_ECX == 1) {
    this->min_length_ = '\0';
    this->max_length_ = '\0';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    in_ECX = (uint)*in_RDX;
    this->symbols_[0] = *in_RDX;
  }
  else {
    this->min_length_ = '\x10';
    this->max_length_ = '\0';
    EVar9 = (EVP_PKEY_CTX)0x10;
    EVar8 = (EVP_PKEY_CTX)0x0;
    for (uVar2 = 0; in_ECX != uVar2; uVar2 = uVar2 + 1) {
      EVar1 = ctx[uVar2];
      if (EVar1 != (EVP_PKEY_CTX)0x0) {
        EVar11 = EVar1;
        if ((byte)EVar1 < (byte)EVar9) {
          this->min_length_ = (uint8_t)EVar1;
          EVar11 = ctx[uVar2];
          EVar9 = EVar1;
        }
        if ((byte)EVar8 < (byte)EVar11) {
          this->max_length_ = (uint8_t)EVar11;
          EVar8 = EVar11;
        }
      }
    }
    if (EVar9 == (EVP_PKEY_CTX)0x0) {
      return in_ECX;
    }
    if ((byte)EVar8 < (byte)EVar9) {
      return in_ECX;
    }
    if (0x10 < (byte)EVar8) {
      return in_ECX;
    }
    uVar10 = 0;
    iVar4 = 0;
    uVar7 = (ulong)(byte)EVar9;
    for (uVar2 = uVar7; uVar2 <= (byte)EVar8; uVar2 = uVar2 + 1) {
      *(short *)((long)this + (uVar2 - uVar7) * 2 + 0x4a) = (short)iVar4 - (short)uVar10;
      for (uVar3 = 0; in_ECX != uVar3; uVar3 = uVar3 + 1) {
        if (uVar2 == (byte)ctx[uVar3]) {
          if (in_RDX == (ushort *)0x0) {
            uVar5 = (ushort)uVar3;
          }
          else {
            uVar5 = in_RDX[uVar3];
          }
          uVar12 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          this->symbols_[uVar12] = uVar5;
          iVar4 = iVar4 + 1;
        }
      }
      uVar6 = (iVar4 << (0x10U - (char)uVar2 & 0x1f)) - 1;
      *(short *)((long)this + (uVar2 - uVar7) * 2 + 0x26) = (short)uVar6;
      if (0xffff < uVar6) {
        return in_ECX;
      }
      iVar4 = iVar4 * 2;
    }
    *(undefined2 *)((long)this + (((ulong)(byte)EVar8 + 1) - uVar7) * 2 + 0x26) = 0xffff;
  }
  this->invalid_ = false;
  return in_ECX;
}

Assistant:

void init(const uint8_t *lengths, const uint16_t *symbols, unsigned num_lengths) {
      invalid_ = true;

      if (num_lengths == 1) {
        min_length_ = 0;
        max_length_ = 0;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        invalid_ = false;
        return;
      }
      if (num_lengths == 2) {
        min_length_ = 1;
        max_length_ = 1;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        symbols_[1] = symbols[1];
        invalid_ = false;
        return;
      }

      min_length_ = 16;
      max_length_ = 0;
      for (unsigned i = 0; i != num_lengths; ++i) {
        if (lengths[i]) {
          if (min_length_ > lengths[i]) min_length_ = lengths[i];
          if (max_length_ < lengths[i]) max_length_ = lengths[i];
        }
      }

      if ( min_length_ <= 0 || min_length_ > max_length_ || max_length_ > 16 ) {
        return;
      }

      unsigned code = 0;
      unsigned huffcode = 0;
      for (unsigned length = min_length_; length <= max_length_; ++length) {
        base_[length-min_length_] = huffcode - code;
        for (unsigned i = 0; i != num_lengths; ++i) {
          if (lengths[i] == length) {
            symbols_[code++] = symbols ? symbols[i] : i;
            huffcode++;
          }
        }
        limits_[length-min_length_] = (uint16_t)( ( huffcode << (16-length) ) - 1 );
        if (( huffcode << (16-length) ) - 1 > 0xffff) {
          return;
        }
        huffcode *= 2;
      }

      // prevent escape from bitstream decoding loop.
      limits_[max_length_+1-min_length_] = 0xffff;
      invalid_ = false;
    }